

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
         *this,size_t new_capacity)

{
  allocator<phmap::priv::(anonymous_namespace)::Entry> *alloc;
  size_t capacity;
  size_t hashval;
  Entry *i_00;
  size_t i;
  size_t sVar1;
  Entry *ts;
  slot_type *f;
  FindInfo FVar2;
  Layout LVar3;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x807,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, std::allocator<phmap::priv::(anonymous namespace)::Entry>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous namespace)::Entry>, Hash = phmap::Hash<phmap::priv::(anonymous namespace)::Entry>, Eq = phmap::EqualTo<phmap::priv::(anonymous namespace)::Entry>, Alloc = std::allocator<phmap::priv::(anonymous namespace)::Entry>]"
                 );
  }
  alloc = (allocator<phmap::priv::(anonymous_namespace)::Entry> *)this->ctrl_;
  f = this->slots_;
  capacity = this->capacity_;
  ts = (Entry *)new_capacity;
  initialize_slots(this,new_capacity);
  this->capacity_ = new_capacity;
  for (sVar1 = 0; capacity != sVar1; sVar1 = sVar1 + 1) {
    if (-1 < (char)alloc[sVar1]) {
      hashval = hash_policy_traits<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,void>
                ::
                apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>::HashElement,phmap::priv::(anonymous_namespace)::Entry&,phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>>
                          ((HashElement *)f,ts);
      FVar2 = find_first_non_full(this,hashval);
      i_00 = (Entry *)FVar2.offset;
      ts = i_00;
      set_ctrl(this,(size_t)i_00,(byte)hashval & 0x7f);
      this->slots_[(long)i_00] = *f;
    }
    f = f + 1;
  }
  if (capacity != 0) {
    LVar3 = MakeLayout(capacity);
    Deallocate<4ul,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>
              (alloc,(void *)((LVar3.
                               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
                               .size_[0] + 3 & 0xfffffffffffffffc) +
                             LVar3.
                             super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
                             .size_[1] * 8),
               LVar3.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::(anonymous_namespace)::Entry>
               .size_[1]);
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }